

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ls.h
# Opt level: O0

string * __thiscall
wabt::LoadStoreTracking::AddrExpName_abi_cxx11_
          (string *__return_storage_ptr__,LoadStoreTracking *this,Node *addr_exp)

{
  VarExpr<(wabt::ExprType)24> *pVVar1;
  VarExpr<(wabt::ExprType)26> *pVVar2;
  string *psVar3;
  allocator<char> local_21;
  Node *local_20;
  Node *addr_exp_local;
  LoadStoreTracking *this_local;
  
  local_20 = addr_exp;
  addr_exp_local = (Node *)this;
  this_local = (LoadStoreTracking *)__return_storage_ptr__;
  if (addr_exp->etype == LocalGet) {
    pVVar1 = cast<wabt::VarExpr<(wabt::ExprType)24>,wabt::Expr>(addr_exp->e);
    psVar3 = Var::name_abi_cxx11_(&pVVar1->var);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar3);
  }
  else if (addr_exp->etype == LocalTee) {
    pVVar2 = cast<wabt::VarExpr<(wabt::ExprType)26>,wabt::Expr>(addr_exp->e);
    psVar3 = Var::name_abi_cxx11_(&pVVar2->var);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar3);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_21);
    std::allocator<char>::~allocator(&local_21);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::string AddrExpName(const Node& addr_exp) const {
    // TODO: expand this to more kinds of address expressions.
    switch (addr_exp.etype) {
      case ExprType::LocalGet:
        return cast<LocalGetExpr>(addr_exp.e)->var.name();
        break;
      case ExprType::LocalTee:
        return cast<LocalTeeExpr>(addr_exp.e)->var.name();
        break;
      default:
        return "";
    }
  }